

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::EndPlot(void)

{
  ImVec2 *pIVar1;
  ImVec2 *spacing;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  ImPlotPlot *plot;
  ImPlotItem *pIVar10;
  undefined8 *puVar11;
  ImVec4 *pIVar12;
  ImPlotContext *pIVar13;
  ImDrawList *pIVar14;
  ImRect *clip_rect_min;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  int c;
  uint uVar18;
  ImU32 IVar19;
  ImU32 IVar20;
  int iVar21;
  ImVec4 *pIVar22;
  char *pcVar23;
  ulong uVar24;
  ImPlotPlot *pIVar25;
  ImPlotTick *pIVar26;
  double *pdVar27;
  ImPlotPlot *pIVar28;
  ImPlotTick *pIVar29;
  float *pfVar30;
  int iVar31;
  long lVar32;
  char cVar33;
  ImPlotAxis *this;
  ImPlotAxis *pIVar34;
  undefined8 in_R9;
  long lVar35;
  ImRect *pIVar36;
  int i_2;
  long lVar37;
  bool *pbVar38;
  ImPlotTickCollection *pIVar39;
  int i;
  ImPlotAnnotation *pIVar40;
  char (*pacVar41) [16];
  ImPlotRange *pIVar42;
  ulong uVar43;
  ImVec2 IVar44;
  double dVar45;
  double dVar46;
  ImVec2 IVar47;
  double dVar48;
  float extraout_XMM0_Dd;
  undefined1 auVar49 [16];
  double dVar52;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  ImPlotDateTimeFmt fmt;
  ImVec2 h3;
  ImRect rect;
  ImVec2 h4;
  ImVec2 v1;
  ImVec2 start;
  ImVec2 v3;
  ImVec2 v4;
  ImVec2 v2;
  undefined1 local_180 [8];
  undefined8 local_178;
  ImPlotAxis *local_170;
  undefined1 local_168 [12];
  float fStack_15c;
  ImDrawList *local_158;
  double dStack_150;
  undefined1 local_148 [12];
  float fStack_13c;
  ImRect *local_130;
  ImGuiIO *local_128;
  ImVec2 local_120;
  ImPlotTickCollection *local_118;
  ImVec2 local_110;
  ImVec4 local_108;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ImVec2 local_88;
  ImVec2 *local_70;
  ImRect *local_68;
  ImVec2 *local_60;
  ImVec2 local_58;
  float *local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar13 = GImPlot;
  if (GImPlot == (ImPlotContext *)0x0) {
    __assert_fail("(GImPlot != __null) && \"No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b6,"void ImPlot::EndPlot()");
  }
  plot = GImPlot->CurrentPlot;
  if (plot == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"Mismatched BeginPlot()/EndPlot()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b8,"void ImPlot::EndPlot()");
  }
  local_158 = GImGui->CurrentWindow->DrawList;
  local_128 = ImGui::GetIO();
  bVar15 = 1;
  if ((plot->YAxis[0].Dragging == false) && (plot->YAxis[1].Dragging == false)) {
    bVar15 = plot->YAxis[2].Dragging;
  }
  PushPlotClipRect((float)(-(uint)((pIVar13->Style).PlotBorderSize == 0.0) & 0x3f800000));
  if (((plot->XAxis).Flags & 0x12U) == 0x10) {
    IVar19 = (plot->XAxis).ColorMaj;
    RenderGridLinesX(local_158,&pIVar13->XTicks,&plot->PlotRect,IVar19,IVar19,
                     (pIVar13->Style).MajorGridSize.x,(pIVar13->Style).MinorGridSize.x);
  }
  this = plot->YAxis;
  local_170 = &plot->XAxis;
  pIVar39 = pIVar13->YTicks;
  lVar32 = 0xf0;
  local_118 = pIVar39;
  do {
    if ((*(char *)((long)plot + lVar32 + -0x3d) == '\x01') &&
       ((*(uint *)((long)plot + lVar32 + -0x60) & 0x12) == 0x10)) {
      RenderGridLinesY(local_158,pIVar39,&plot->PlotRect,*(ImU32 *)((long)plot + lVar32 + -4),
                       *(ImU32 *)((long)&plot->ID + lVar32),(pIVar13->Style).MajorGridSize.y,
                       (pIVar13->Style).MinorGridSize.y);
    }
    pIVar39 = pIVar39 + 1;
    lVar32 = lVar32 + 0x80;
  } while (lVar32 != 0x270);
  local_130 = &plot->PlotRect;
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  if (((local_170->Flags & 4) == 0) && (iVar21 = (pIVar13->XTicks).Size, 0 < iVar21)) {
    lVar32 = 0x1c;
    lVar35 = 0;
    do {
      if ((pIVar13->XTicks).Ticks.Size <= lVar35) goto LAB_001b4d65;
      pIVar29 = (pIVar13->XTicks).Ticks.Data;
      if (*(int *)((long)&pIVar29->PlotPos + lVar32) == 0) {
        local_168._0_4_ = *(float *)((long)pIVar29 + lVar32 + -0x14);
        local_108.y = (plot->PlotRect).Max.y;
        local_108.x = (float)local_168._0_4_;
        uVar18 = *(byte *)((long)pIVar29 + lVar32 + -4) ^ 1;
        local_168._4_4_ = local_108.y - ((ImVec2 *)((pIVar13->Style).Colors + -8))[uVar18].x;
        ImDrawList::AddLine(local_158,(ImVec2 *)&local_108,(ImVec2 *)local_168,
                            (plot->XAxis).ColorMaj,
                            ((ImVec2 *)((pIVar13->Style).Colors + -7))[uVar18].x);
        iVar21 = (pIVar13->XTicks).Size;
      }
      lVar35 = lVar35 + 1;
      lVar32 = lVar32 + 0x20;
    } while (lVar35 < iVar21);
  }
  ImGui::PopClipRect();
  local_68 = &plot->FrameRect;
  local_70 = &(plot->FrameRect).Max;
  local_60 = &(plot->PlotRect).Max;
  local_108.y = (plot->PlotRect).Max.y;
  local_108.x = (plot->FrameRect).Max.x;
  ImGui::PushClipRect(&local_130->Min,(ImVec2 *)&local_108,true);
  local_50 = &(pIVar13->Style).MajorTickLen.y;
  local_58 = (ImVec2)&(pIVar13->Style).MajorTickSize.y;
  local_88 = (ImVec2)&(pIVar13->Style).MinorTickSize.y;
  lVar32 = 0;
  iVar21 = 0;
  do {
    iVar31 = iVar21;
    if (plot->YAxis[lVar32].Present == true) {
      auVar57 = ZEXT416((uint)pIVar13->YAxisReference[lVar32]);
      if (((this[lVar32].Flags & 4) == 0) && (0 < local_118[lVar32].Size)) {
        pIVar39 = local_118 + lVar32;
        lVar35 = 0x18;
        lVar37 = 0;
        _local_148 = auVar57;
        do {
          if ((pIVar39->Ticks).Size <= lVar37) goto LAB_001b4d65;
          pIVar29 = (pIVar39->Ticks).Data;
          local_108.y = *(float *)((long)pIVar29 + lVar35 + -0x10);
          local_108.x = local_148._0_4_;
          if ((1 < iVar21) ||
             (pfVar30 = local_50, *(char *)((long)&pIVar29->PlotPos + lVar35) == '\0')) {
            pfVar30 = &(pIVar13->Style).MinorTickLen.y;
          }
          local_168._0_4_ = *pfVar30;
          if (lVar32 != 0) {
            local_168._0_4_ = -(float)local_168._0_4_;
          }
          local_168._0_4_ = local_148._0_4_ + (float)local_168._0_4_;
          local_168._4_4_ = local_108.y + 0.0;
          if ((1 < iVar21) ||
             (IVar47 = local_58, *(char *)((long)&pIVar29->PlotPos + lVar35) == '\0')) {
            IVar47 = local_88;
          }
          ImDrawList::AddLine(local_158,(ImVec2 *)&local_108,(ImVec2 *)local_168,
                              this[lVar32].ColorMaj,*(float *)IVar47);
          lVar37 = lVar37 + 1;
          lVar35 = lVar35 + 0x20;
          auVar57 = _local_148;
        } while (lVar37 < pIVar39->Size);
      }
      iVar31 = iVar21 + 1;
      if (1 < iVar21) {
        local_168._4_4_ = (plot->PlotRect).Min.y;
        local_168._0_4_ = auVar57._0_4_;
        local_180._4_4_ = (plot->PlotRect).Max.y;
        local_180._0_4_ = local_168._0_4_;
        fVar59 = (GImPlot->Style).Colors[0x14].w;
        if ((fVar59 != -1.0) || (NAN(fVar59))) {
          local_108.z = (GImPlot->Style).Colors[0x14].z;
          local_108.w = (GImPlot->Style).Colors[0x14].w;
          pIVar22 = (GImPlot->Style).Colors + 0x14;
        }
        else {
          fVar59 = (GImPlot->Style).Colors[0x13].w;
          if ((fVar59 != -1.0) || (NAN(fVar59))) {
            pIVar22 = (GImPlot->Style).Colors + 0x13;
            pIVar12 = (GImPlot->Style).Colors + 0x13;
          }
          else {
            pIVar22 = ImGui::GetStyleColorVec4(0);
            pIVar12 = pIVar22;
          }
          uVar2 = pIVar12->z;
          uVar5 = pIVar12->w;
          local_108.w = (float)uVar5 * 0.25;
          local_108.z = (float)uVar2;
        }
        local_108.x = pIVar22->x;
        local_108.y = pIVar22->y;
        IVar19 = ImGui::ColorConvertFloat4ToU32(&local_108);
        ImDrawList::AddLine(local_158,(ImVec2 *)local_168,(ImVec2 *)local_180,IVar19,1.0);
      }
    }
    lVar32 = lVar32 + 1;
    iVar21 = iVar31;
  } while (lVar32 != 3);
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  if (0 < (pIVar13->Annotations).Size) {
    lVar32 = 0;
    do {
      pcVar23 = ImPlotAnnotationCollection::GetText(&pIVar13->Annotations,(int)lVar32);
      if ((pIVar13->Annotations).Annotations.Size <= lVar32) {
        pcVar23 = "T &ImVector<ImPlotAnnotation>::operator[](int) [T = ImPlotAnnotation]";
        goto LAB_001b4d7a;
      }
      pIVar40 = (pIVar13->Annotations).Annotations.Data;
      IVar44 = ImGui::CalcTextSize(pcVar23,(char *)0x0,false,-1.0);
      IVar47 = (pIVar13->Style).AnnotationPadding;
      fVar60 = IVar47.x;
      fVar59 = IVar47.y;
      local_168._8_4_ = fVar60 + fVar60 + IVar44.x;
      fStack_15c = fVar59 + fVar59 + IVar44.y;
      fVar59 = pIVar40[lVar32].Pos.y;
      local_168._4_4_ = pIVar40[lVar32].Offset.x;
      local_168._0_4_ = pIVar40[lVar32].Offset.x;
      fStack_13c = 0.0;
      if (((float)local_168._0_4_ != 0.0) || (NAN((float)local_168._0_4_))) {
        if (0.0 < (float)local_168._0_4_) goto LAB_001b358c;
        local_168._0_4_ = fVar59 - ((float)local_168._8_4_ - (float)local_168._0_4_);
        fStack_13c = 0.0;
      }
      else {
        local_168._0_4_ = (float)local_168._8_4_ * -0.5;
        fStack_13c = extraout_XMM0_Dd + 0.0;
LAB_001b358c:
        local_168._0_4_ = (float)local_168._0_4_ + fVar59;
      }
      pIVar40 = pIVar40 + lVar32;
      fVar59 = (pIVar40->Offset).y;
      if ((fVar59 != 0.0) || (NAN(fVar59))) {
        if (0.0 < fVar59) goto LAB_001b35bb;
        local_168._4_4_ = (float)local_168._4_4_ - (fStack_15c - fVar59);
      }
      else {
        fVar59 = fStack_15c * -0.5;
LAB_001b35bb:
        local_168._4_4_ = (float)local_168._4_4_ + fVar59;
      }
      if (pIVar40->Clamp == true) {
        fVar59 = (plot->PlotRect).Min.x;
        if ((float)local_168._0_4_ < fVar59) {
          local_168._0_4_ = fVar59;
        }
        fVar59 = (plot->PlotRect).Min.y;
        if ((float)local_168._4_4_ < fVar59) {
          local_168._4_4_ = fVar59;
        }
        fVar59 = (plot->PlotRect).Max.x;
        if (fVar59 < (float)local_168._8_4_ + (float)local_168._0_4_) {
          local_168._0_4_ = fVar59 - (float)local_168._8_4_;
        }
        fVar59 = (plot->PlotRect).Max.y;
        if (fVar59 < fStack_15c + (float)local_168._4_4_) {
          local_168._4_4_ = fVar59 - fStack_15c;
        }
      }
      local_168._8_4_ = (float)local_168._8_4_ + (float)local_168._0_4_;
      fStack_15c = fStack_15c + (float)local_168._4_4_;
      local_148._4_4_ = local_168._4_4_;
      local_148._0_4_ = local_168._0_4_;
      local_148._8_4_ = 0;
      fVar59 = (pIVar40->Offset).x;
      if ((((fVar59 != 0.0) || (NAN(fVar59))) || (fVar59 = (pIVar40->Offset).y, fVar59 != 0.0)) ||
         (NAN(fVar59))) {
        auVar57._4_4_ = local_168._4_4_;
        auVar57._0_4_ = local_168._0_4_;
        auVar57._8_4_ = local_168._8_4_;
        auVar57._12_4_ = fStack_15c;
        local_108.y = (float)local_168._4_4_;
        local_108.x = (float)local_168._0_4_;
        local_108.w = (float)local_168._4_4_;
        local_108.z = (float)local_168._8_4_;
        local_f8._0_8_ = auVar57._8_8_;
        local_f8._8_4_ = local_168._0_4_;
        local_f8._12_4_ = fStack_15c;
        uVar24 = 0;
        uVar43 = 0;
        fVar59 = 3.4028235e+38;
        do {
          fVar60 = (pIVar40->Pos).x - (&local_108.x)[uVar24 * 2];
          fVar61 = (pIVar40->Pos).y - (&local_108.y)[uVar24 * 2];
          fVar60 = fVar60 * fVar60 + fVar61 * fVar61;
          if (fVar60 < fVar59) {
            uVar43 = uVar24 & 0xffffffff;
            fVar59 = fVar60;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != 4);
        ImDrawList::AddLine(local_158,&pIVar40->Pos,(ImVec2 *)(&local_108.x + (long)(int)uVar43 * 2)
                            ,pIVar40->ColorBg,1.0);
      }
      pIVar14 = local_158;
      ImDrawList::AddRectFilled
                (local_158,(ImVec2 *)local_168,(ImVec2 *)(local_168 + 8),pIVar40->ColorBg,0.0,0);
      IVar47 = (pIVar13->Style).AnnotationPadding;
      local_108.x = (float)local_148._0_4_ + IVar47.x;
      local_108.y = (float)local_148._4_4_ + IVar47.y;
      ImDrawList::AddText(pIVar14,(ImVec2 *)&local_108,pIVar40->ColorFg,pcVar23,(char *)0x0);
      lVar32 = lVar32 + 1;
    } while (lVar32 < (pIVar13->Annotations).Size);
  }
  if (plot->Selected != false) {
    IVar47 = (plot->SelectRect).Min;
    IVar44 = (plot->PlotRect).Min;
    fVar59 = IVar44.x;
    local_180._0_4_ = IVar47.x + fVar59;
    local_180._4_4_ = IVar47.y + IVar44.y;
    IVar47 = (plot->SelectRect).Max;
    local_120.x = fVar59 + IVar47.x;
    local_120.y = (plot->PlotRect).Min.y + IVar47.y;
    fVar59 = (GImPlot->Style).Colors[0x15].w;
    if ((fVar59 != -1.0) || (NAN(fVar59))) {
      local_168._0_4_ = (GImPlot->Style).Colors[0x15].x;
      local_168._4_4_ = (GImPlot->Style).Colors[0x15].y;
      uVar53._0_4_ = (GImPlot->Style).Colors[0x15].z;
      uVar53._4_4_ = (GImPlot->Style).Colors[0x15].w;
    }
    else {
      uVar53 = 0x3f80000000000000;
      local_168._0_4_ = 1.0;
      local_168._4_4_ = 1.0;
    }
    local_168._8_4_ = (undefined4)uVar53;
    fStack_15c = (float)((ulong)uVar53 >> 0x20);
    local_108.y = (float)local_168._4_4_;
    local_108.x = (float)local_168._0_4_;
    local_108.w = fStack_15c * 0.25;
    local_108.z = (float)local_168._8_4_;
    IVar19 = ImGui::GetColorU32(&local_108);
    IVar20 = ImGui::GetColorU32((ImVec4 *)local_168);
    pIVar14 = local_158;
    ImDrawList::AddRectFilled(local_158,(ImVec2 *)local_180,&local_120,IVar19,0.0,0);
    ImDrawList::AddRect(pIVar14,(ImVec2 *)local_180,&local_120,IVar20,0.0,0,1.0);
  }
  if (plot->Queried == true) {
    IVar47 = (plot->QueryRect).Min;
    IVar44 = (plot->PlotRect).Min;
    fVar59 = IVar44.x;
    local_180._0_4_ = IVar47.x + fVar59;
    local_180._4_4_ = IVar47.y + IVar44.y;
    IVar47 = (plot->QueryRect).Max;
    local_120.x = fVar59 + IVar47.x;
    local_120.y = (plot->PlotRect).Min.y + IVar47.y;
    fVar59 = (GImPlot->Style).Colors[0x16].w;
    if ((fVar59 != -1.0) || (NAN(fVar59))) {
      local_168._0_4_ = (GImPlot->Style).Colors[0x16].x;
      local_168._4_4_ = (GImPlot->Style).Colors[0x16].y;
      uVar54._0_4_ = (GImPlot->Style).Colors[0x16].z;
      uVar54._4_4_ = (GImPlot->Style).Colors[0x16].w;
    }
    else {
      local_168._0_4_ = 0.0;
      local_168._4_4_ = 1.0;
      uVar54 = 0x3f80000000000000;
    }
    local_168._8_4_ = (undefined4)uVar54;
    fStack_15c = (float)((ulong)uVar54 >> 0x20);
    local_108.y = (float)local_168._4_4_;
    local_108.x = (float)local_168._0_4_;
    local_108.w = fStack_15c * 0.25;
    local_108.z = (float)local_168._8_4_;
    IVar19 = ImGui::GetColorU32(&local_108);
    IVar20 = ImGui::GetColorU32((ImVec4 *)local_168);
    pIVar14 = local_158;
    ImDrawList::AddRectFilled(local_158,(ImVec2 *)local_180,&local_120,IVar19,0.0,0);
    ImDrawList::AddRect(pIVar14,(ImVec2 *)local_180,&local_120,IVar20,0.0,0,1.0);
  }
  uVar18 = plot->Flags;
  pIVar36 = local_130;
  if ((((((uVar18 >> 0xb & 1) != 0) && (plot->PlotHovered == true)) &&
       (((bVar15 | (plot->XAxis).Dragging) & 1) == 0)) &&
      ((plot->Selecting == false && (plot->Querying == false)))) && (plot->LegendHovered == false))
  {
    ImGui::SetMouseCursor(-1);
    local_48.x = (local_128->MousePos).x;
    local_168._4_4_ = (local_128->MousePos).y;
    local_108.y = (float)local_168._4_4_;
    local_108.x = (plot->PlotRect).Min.x;
    local_168._0_4_ = local_48.x + -5.0;
    local_180._4_4_ = local_168._4_4_;
    local_180._0_4_ = local_48.x + 5.0;
    local_120.y = (float)local_168._4_4_;
    local_120.x = (plot->PlotRect).Max.x;
    local_110.y = (plot->PlotRect).Min.y;
    local_110.x = local_48.x;
    local_38.y = (float)local_168._4_4_ + -5.0;
    local_48.y = (float)local_168._4_4_ + 5.0;
    local_40.y = (plot->PlotRect).Max.y;
    local_40.x = local_48.x;
    local_38.x = local_48.x;
    IVar19 = GetStyleColorU32(0x17);
    pIVar14 = local_158;
    ImDrawList::AddLine(local_158,(ImVec2 *)&local_108,(ImVec2 *)local_168,IVar19,1.0);
    ImDrawList::AddLine(pIVar14,(ImVec2 *)local_180,&local_120,IVar19,1.0);
    pIVar36 = local_130;
    ImDrawList::AddLine(pIVar14,&local_110,&local_38,IVar19,1.0);
    ImDrawList::AddLine(pIVar14,&local_48,&local_40,IVar19,1.0);
    uVar18 = plot->Flags;
  }
  if (((uVar18 & 0x10) == 0) && (plot->PlotHovered == true)) {
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = ZEXT816(0);
    local_108.x = 0.0;
    local_108.y = 0.0;
    local_108.z = 0.0;
    local_108.w = 0.0;
    local_180 = (undefined1  [8])&local_108;
    local_178._0_4_ = 0x80;
    local_178._4_4_ = 0;
    if ((local_170->Flags & 0x40) == 0) {
      pcVar23 = (GImPlot->NextPlotData).FmtX;
      if ((GImPlot->NextPlotData).HasFmtX == false) {
        pcVar23 = "%g";
      }
      local_148._0_8_ = pIVar13->MousePos[0].x;
      if ((pIVar13->XTicks).Size < 2) {
        pIVar25 = (ImPlotPlot *)&(plot->XAxis).Range;
        pIVar28 = plot;
      }
      else {
        if ((pIVar13->XTicks).Ticks.Size < 2) goto LAB_001b4df8;
        pIVar25 = (ImPlotPlot *)(pIVar13->XTicks).Ticks.Data;
        pIVar28 = pIVar25;
      }
      dVar45 = (pIVar28->XAxis).Range.Max - *(double *)pIVar25;
      if ((dVar45 != 0.0) || (NAN(dVar45))) {
        dVar45 = log10(ABS(dVar45));
        dVar45 = floor(dVar45);
        iVar21 = 0;
        if ((int)dVar45 < 1) {
          iVar21 = 1 - (int)dVar45;
        }
        dVar45 = (double)iVar21;
      }
      else {
        dVar45 = 1.0;
      }
      dVar45 = pow(10.0,dVar45);
      dVar46 = floor((double)local_148._0_8_ * dVar45 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,pcVar23,dVar46 / dVar45);
    }
    else {
      pdVar27 = (double *)&GetUnitForRange(double)::cutoffs;
      uVar43 = 0;
      do {
        if (((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
            (double)(((plot->PlotRect).Max.x - (plot->PlotRect).Min.x) / 100.0) <= *pdVar27)
        goto LAB_001b3cf2;
        uVar43 = uVar43 + 1;
        pdVar27 = pdVar27 + 1;
      } while (uVar43 != 8);
      uVar43 = 8;
LAB_001b3cf2:
      uVar24 = 7;
      if ((uint)uVar43 < 7) {
        uVar24 = uVar43 & 0xffffffff;
      }
      dVar45 = pIVar13->MousePos[0].x;
      local_148._0_8_ = dVar45;
      dVar46 = floor(dVar45);
      iVar21 = (int)((double)local_148._0_8_ * 1000000.0 + dVar46 * -1000000.0);
      local_168._0_8_ = (long)dVar45 + (long)(iVar21 / 1000000);
      local_168._8_4_ = iVar21 % 1000000;
      uVar8 = (GImPlot->Style).UseISO8601;
      uVar9 = (GImPlot->Style).Use24HourClock;
      fmt.Date._1_1_ = uVar9;
      fmt.Date._0_1_ = uVar8;
      fmt._2_6_ = 0;
      fmt._8_4_ = (undefined4)in_R9;
      iVar21 = FormatDateTime((ImPlot *)local_168,(ImPlotTime *)&local_108,(char *)0x7f,
                              (int)*(undefined8 *)
                                    ((long)&TimeFormatMouseCursor + (uVar24 * 3 & 0xffffffff) * 4),
                              fmt);
      if (0 < iVar21) {
        iVar31 = ~local_178._4_4_ + (int)local_178;
        if (iVar21 < (int)(~local_178._4_4_ + (int)local_178)) {
          iVar31 = iVar21;
        }
        local_178._4_4_ = iVar31 + local_178._4_4_;
      }
    }
    ImBufferWriter::Write((ImBufferWriter *)local_180,", ");
    pacVar41 = (GImPlot->NextPlotData).FmtY;
    if ((GImPlot->NextPlotData).HasFmtY[0] == false) {
      pacVar41 = (char (*) [16])0x347f55;
    }
    local_148._0_8_ = pIVar13->MousePos[0].y;
    if (pIVar13->YTicks[0].Size < 2) {
      pIVar29 = (ImPlotTick *)&plot->YAxis[0].Range.Max;
      pIVar26 = (ImPlotTick *)&plot->YAxis[0].Range;
    }
    else {
      if ((local_118->Ticks).Size < 2) goto LAB_001b4df8;
      pIVar26 = pIVar13->YTicks[0].Ticks.Data;
      pIVar29 = pIVar26 + 1;
    }
    dVar45 = (double)pIVar29->PlotPos - pIVar26->PlotPos;
    if ((dVar45 != 0.0) || (NAN(dVar45))) {
      dVar45 = log10(ABS(dVar45));
      dVar45 = floor(dVar45);
      iVar21 = 0;
      if ((int)dVar45 < 1) {
        iVar21 = 1 - (int)dVar45;
      }
      dVar45 = (double)iVar21;
    }
    else {
      dVar45 = 1.0;
    }
    dVar45 = pow(10.0,dVar45);
    dVar46 = floor((double)local_148._0_8_ * dVar45 + 0.5);
    ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar41,dVar46 / dVar45);
    uVar18 = plot->Flags;
    if ((uVar18 >> 8 & 1) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)local_180,", (");
      pacVar41 = (GImPlot->NextPlotData).FmtY + 1;
      if ((GImPlot->NextPlotData).HasFmtY[1] == false) {
        pacVar41 = (char (*) [16])0x347f55;
      }
      local_148._0_8_ = pIVar13->MousePos[1].y;
      if (pIVar13->YTicks[1].Size < 2) {
        pIVar29 = (ImPlotTick *)&plot->YAxis[1].Range.Max;
        pIVar26 = (ImPlotTick *)&plot->YAxis[1].Range;
      }
      else {
        if (pIVar13->YTicks[1].Ticks.Size < 2) goto LAB_001b4df8;
        pIVar26 = pIVar13->YTicks[1].Ticks.Data;
        pIVar29 = pIVar26 + 1;
      }
      dVar45 = (double)pIVar29->PlotPos - pIVar26->PlotPos;
      if ((dVar45 != 0.0) || (NAN(dVar45))) {
        dVar45 = log10(ABS(dVar45));
        dVar45 = floor(dVar45);
        iVar21 = 0;
        if ((int)dVar45 < 1) {
          iVar21 = 1 - (int)dVar45;
        }
        dVar45 = (double)iVar21;
      }
      else {
        dVar45 = 1.0;
      }
      dVar45 = pow(10.0,dVar45);
      dVar46 = floor((double)local_148._0_8_ * dVar45 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar41,dVar46 / dVar45);
      ImBufferWriter::Write((ImBufferWriter *)local_180,")");
      uVar18 = plot->Flags;
      pIVar36 = local_130;
    }
    if ((uVar18 >> 9 & 1) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)local_180,", (");
      pacVar41 = (char (*) [16])0x347f55;
      if ((GImPlot->NextPlotData).HasFmtY[2] != false) {
        pacVar41 = (GImPlot->NextPlotData).FmtY + 2;
      }
      local_148._0_8_ = pIVar13->MousePos[2].y;
      if (pIVar13->YTicks[2].Size < 2) {
        pIVar29 = (ImPlotTick *)&plot->YAxis[2].Range.Max;
        pIVar26 = (ImPlotTick *)&plot->YAxis[2].Range;
      }
      else {
        if (pIVar13->YTicks[2].Ticks.Size < 2) {
LAB_001b4df8:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68c,
                        "const T &ImVector<ImPlotTick>::operator[](int) const [T = ImPlotTick]");
        }
        pIVar26 = pIVar13->YTicks[2].Ticks.Data;
        pIVar29 = pIVar26 + 1;
      }
      dVar45 = (double)pIVar29->PlotPos - pIVar26->PlotPos;
      if ((dVar45 != 0.0) || (NAN(dVar45))) {
        dVar45 = log10(ABS(dVar45));
        dVar45 = floor(dVar45);
        iVar21 = 0;
        if ((int)dVar45 < 1) {
          iVar21 = 1 - (int)dVar45;
        }
        dVar45 = (double)iVar21;
      }
      else {
        dVar45 = 1.0;
      }
      dVar45 = pow(10.0,dVar45);
      dVar46 = floor((double)local_148._0_8_ * dVar45 + 0.5);
      ImBufferWriter::Write((ImBufferWriter *)local_180,*pacVar41,dVar46 / dVar45);
      ImBufferWriter::Write((ImBufferWriter *)local_180,")");
    }
    local_120 = ImGui::CalcTextSize((char *)&local_108,(char *)0x0,false,-1.0);
    local_110 = GetLocationPos(pIVar36,&local_120,plot->MousePosLocation,
                               &(pIVar13->Style).MousePosPadding);
    fVar59 = (GImPlot->Style).Colors[0xc].w;
    if ((fVar59 != -1.0) || (NAN(fVar59))) {
      pIVar22 = (GImPlot->Style).Colors + 0xc;
      pIVar12 = (GImPlot->Style).Colors + 0xc;
    }
    else {
      pIVar22 = ImGui::GetStyleColorVec4(0);
      pIVar12 = pIVar22;
    }
    uVar3 = pIVar22->x;
    uVar6 = pIVar22->y;
    uVar4 = pIVar12->z;
    uVar7 = pIVar12->w;
    local_168._0_4_ = uVar3;
    local_168._4_4_ = uVar6;
    local_168._8_4_ = uVar4;
    fStack_15c = (float)uVar7;
    IVar19 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_168);
    ImDrawList::AddText(local_158,&local_110,IVar19,(char *)&local_108,(char *)0x0);
  }
  ImGui::PopClipRect();
  plot->LegendHovered = false;
  auVar57 = _DAT_00373420;
  uVar18 = (plot->Items).Buf.Size;
  if (uVar18 == (plot->Items).Map.Data.Size) {
    if (0 < (int)uVar18) {
      lVar32 = (ulong)uVar18 - 1;
      auVar49._8_4_ = (int)lVar32;
      auVar49._0_8_ = lVar32;
      auVar49._12_4_ = (int)((ulong)lVar32 >> 0x20);
      pIVar10 = (plot->Items).Buf.Data;
      lVar32 = 0;
      auVar49 = auVar49 ^ _DAT_00347250;
      auVar55 = _DAT_0036ca20;
      do {
        bVar17 = auVar49._0_4_ < SUB164(auVar55 ^ _DAT_00347250,0);
        iVar21 = auVar49._4_4_;
        iVar31 = SUB164(auVar55 ^ _DAT_00347250,4);
        if ((bool)(~(iVar21 < iVar31 || iVar31 == iVar21 && bVar17) & 1)) {
          (&pIVar10->LegendHovered)[lVar32] = false;
        }
        if (iVar21 >= iVar31 && (iVar31 != iVar21 || !bVar17)) {
          (&pIVar10[1].LegendHovered)[lVar32] = false;
        }
        lVar35 = auVar55._8_8_;
        auVar55._0_8_ = auVar55._0_8_ + auVar57._0_8_;
        auVar55._8_8_ = lVar35 + auVar57._8_8_;
        lVar32 = lVar32 + 0x20;
      } while ((ulong)(uVar18 + 1 >> 1) << 5 != lVar32);
    }
    if (((plot->Flags & 2) == 0) && (0 < (plot->LegendData).Indices.Size)) {
      pIVar1 = &(pIVar13->Style).LegendInnerPadding;
      spacing = &(pIVar13->Style).LegendSpacing;
      local_148._0_8_ = pIVar1;
      local_88 = CalcLegendSize(plot,pIVar1,spacing,plot->LegendOrientation);
      clip_rect_min = local_68;
      local_168._0_4_ = local_88.x;
      local_168._4_4_ = local_88.y;
      bVar17 = plot->LegendOutside;
      if (bVar17 != false) {
        pIVar36 = local_68;
      }
      IVar47 = GetLocationPos(pIVar36,(ImVec2 *)local_168,plot->LegendLocation,
                              (ImVec2 *)
                              ((long)&((ImVec2 *)((pIVar13->Style).Colors + -5))->x +
                              (ulong)((bVar17 ^ 1) << 4)));
      IVar44.x = local_88.x + IVar47.x;
      IVar44.y = local_88.y + IVar47.y;
      (plot->LegendRect).Min = IVar47;
      (plot->LegendRect).Max = IVar44;
      if ((plot->FrameHovered != true) || (fVar59 = (local_128->MousePos).x, fVar59 < IVar47.x)) {
        bVar16 = false;
      }
      else {
        fVar60 = (local_128->MousePos).y;
        bVar16 = false;
        if ((IVar47.y <= fVar60) && (fVar59 < IVar44.x)) {
          bVar16 = fVar60 < IVar44.y;
        }
      }
      plot->LegendHovered = bVar16;
      if (bVar17 == false) {
        PushPlotClipRect(0.0);
      }
      else {
        ImGui::PushClipRect(&clip_rect_min->Min,local_70,true);
      }
      fVar59 = (GImPlot->Style).Colors[8].w;
      if ((fVar59 != -1.0) || (NAN(fVar59))) {
        pIVar22 = (GImPlot->Style).Colors + 8;
        pIVar12 = (GImPlot->Style).Colors + 8;
      }
      else {
        pIVar22 = ImGui::GetStyleColorVec4(4);
        pIVar12 = pIVar22;
      }
      pIVar36 = &plot->LegendRect;
      pIVar1 = &(plot->LegendRect).Max;
      local_108.x = pIVar22->x;
      local_108.y = pIVar22->y;
      local_108.z = pIVar12->z;
      local_108.w = pIVar12->w;
      IVar19 = ImGui::ColorConvertFloat4ToU32(&local_108);
      fVar59 = (GImPlot->Style).Colors[9].w;
      if ((fVar59 != -1.0) || (NAN(fVar59))) {
        pIVar22 = (GImPlot->Style).Colors + 9;
        pfVar30 = &(GImPlot->Style).Colors[9].z;
      }
      else {
        fVar59 = (GImPlot->Style).Colors[7].w;
        if ((fVar59 != -1.0) || (NAN(fVar59))) {
          pIVar22 = (GImPlot->Style).Colors + 7;
          pfVar30 = &(GImPlot->Style).Colors[7].z;
        }
        else {
          pIVar22 = ImGui::GetStyleColorVec4(5);
          pfVar30 = &pIVar22->z;
        }
      }
      local_108.x = pIVar22->x;
      local_108.y = pIVar22->y;
      local_108._8_8_ = *(undefined8 *)pfVar30;
      IVar20 = ImGui::ColorConvertFloat4ToU32(&local_108);
      pIVar14 = local_158;
      ImDrawList::AddRectFilled(local_158,&pIVar36->Min,pIVar1,IVar19,0.0,0);
      ImDrawList::AddRect(pIVar14,&pIVar36->Min,pIVar1,IVar20,0.0,0,1.0);
      ShowLegendEntries(plot,pIVar36,plot->LegendHovered,(ImVec2 *)local_148._0_8_,spacing,
                        plot->LegendOrientation,pIVar14);
      ImGui::PopClipRect();
      pIVar36 = local_130;
    }
    else {
      (plot->LegendRect).Min.x = 0.0;
      (plot->LegendRect).Min.y = 0.0;
      (plot->LegendRect).Max.x = 0.0;
      (plot->LegendRect).Max.y = 0.0;
    }
    if (plot->LegendFlipSideNextFrame == true) {
      plot->LegendOutside = (bool)(plot->LegendOutside ^ 1);
      plot->LegendFlipSideNextFrame = false;
    }
    if (0.0 < (pIVar13->Style).PlotBorderSize) {
      fVar59 = (GImPlot->Style).Colors[7].w;
      if ((fVar59 != -1.0) || (NAN(fVar59))) {
        pIVar22 = (GImPlot->Style).Colors + 7;
        pIVar12 = (GImPlot->Style).Colors + 7;
      }
      else {
        pIVar22 = ImGui::GetStyleColorVec4(5);
        pIVar12 = pIVar22;
      }
      local_108.x = pIVar22->x;
      local_108.y = pIVar22->y;
      local_108.z = pIVar12->z;
      local_108.w = pIVar12->w;
      IVar19 = ImGui::ColorConvertFloat4ToU32(&local_108);
      ImDrawList::AddRect(local_158,&pIVar36->Min,local_60,IVar19,0.0,0xf0,
                          (pIVar13->Style).PlotBorderSize);
    }
    if ((pIVar13->FitThisFrame == true) &&
       ((0 < pIVar13->VisibleItemCount || (plot->Queried == true)))) {
      cVar33 = (char)plot->Flags;
      if (pIVar13->FitX == true) {
        dVar48 = (double)(pIVar13->Style).FitPadding.x;
        dVar46 = (pIVar13->ExtentsX).Min;
        dVar52 = (pIVar13->ExtentsX).Max;
        dVar45 = (dVar52 - dVar46) * 0.5;
        dVar46 = dVar48 * -dVar45 + dVar46;
        dVar52 = dVar48 * dVar45 + dVar52;
        (pIVar13->ExtentsX).Min = dVar46;
        (pIVar13->ExtentsX).Max = dVar52;
        if (((plot->XAxis).Present == true) &&
           (((plot->XAxis).HasRange != true || ((plot->XAxis).RangeCond != 1)))) {
          if (((local_170->Flags & 0x800) == 0) && ((long)ABS(dVar46) < 0x7ff0000000000000)) {
            (plot->XAxis).Range.Min = dVar46;
          }
          if (((local_170->Flags & 0x1000) == 0) && ((long)ABS(dVar52) < 0x7ff0000000000000)) {
            (plot->XAxis).Range.Max = dVar52;
          }
        }
        dVar46 = (plot->XAxis).Range.Min;
        dVar52 = (plot->XAxis).Range.Max;
        dVar45 = (double)((ulong)(dVar52 - dVar46) & (ulong)DAT_0037bcc0);
        if ((dVar45 < 2.2250738585072014e-308) ||
           (dVar48 = (double)((ulong)(dVar52 + dVar46) & (ulong)DAT_0037bcc0) *
                     2.220446049250313e-16, dVar45 < dVar48 + dVar48)) {
          (plot->XAxis).Range.Min = dVar46 + -0.5;
          (plot->XAxis).Range.Max = dVar52 + 0.5;
        }
        ImPlotAxis::Constrain(local_170);
        if ((cVar33 < '\0') && (pIVar13->FitY[0] == false)) {
          ImPlotAxis::SetAspect
                    (this,((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
                          (double)(plot->XAxis).Pixels);
        }
      }
      pbVar38 = pIVar13->FitY;
      pIVar42 = pIVar13->ExtentsY;
      lVar32 = 0;
      local_158 = (ImDrawList *)pbVar38;
      do {
        if (*pbVar38 == true) {
          dVar46 = (double)(pIVar13->Style).FitPadding.y;
          dVar45 = (pIVar42->Max - pIVar42->Min) * 0.5;
          dVar52 = dVar46 * -dVar45 + pIVar42->Min;
          dVar45 = dVar46 * dVar45 + pIVar42->Max;
          pIVar42->Min = dVar52;
          pIVar42->Max = dVar45;
          pIVar34 = (ImPlotAxis *)((long)&this->Flags + lVar32);
          if (((&plot->YAxis[0].Present)[lVar32] == true) &&
             (((&plot->YAxis[0].HasRange)[lVar32] != true ||
              (*(int *)((long)&plot->YAxis[0].RangeCond + lVar32) != 1)))) {
            if (((pIVar34->Flags & 0x800) == 0) && ((long)ABS(dVar52) < 0x7ff0000000000000)) {
              *(double *)((long)&plot->YAxis[0].Range.Min + lVar32) = dVar52;
            }
            if (((pIVar34->Flags & 0x1000) == 0) && ((long)ABS(dVar45) < 0x7ff0000000000000)) {
              *(double *)((long)&plot->YAxis[0].Range.Max + lVar32) = dVar45;
            }
          }
          pdVar27 = (double *)((long)&plot->YAxis[0].Range.Min + lVar32);
          dVar45 = *pdVar27;
          dVar46 = pdVar27[1];
          dVar52 = ABS(dVar46 + dVar45) * 2.220446049250313e-16;
          if ((ABS(dVar46 - dVar45) < 2.2250738585072014e-308) ||
             (ABS(dVar46 - dVar45) < dVar52 + dVar52)) {
            pdVar27 = (double *)((long)&plot->YAxis[0].Range.Min + lVar32);
            *pdVar27 = dVar45 + -0.5;
            pdVar27[1] = dVar46 + 0.5;
          }
          ImPlotAxis::Constrain(pIVar34);
          if ((lVar32 == 0 && cVar33 < '\0') && (pIVar13->FitX == false)) {
            ImPlotAxis::SetAspect
                      (local_170,
                       (plot->YAxis[0].Range.Max - plot->YAxis[0].Range.Min) /
                       (double)plot->YAxis[0].Pixels);
          }
        }
        lVar32 = lVar32 + 0x80;
        pIVar42 = pIVar42 + 1;
        pbVar38 = pbVar38 + 1;
      } while (lVar32 != 0x180);
      if (((cVar33 < '\0') && (pIVar13->FitX == true)) &&
         (*(bool *)&(local_158->CmdBuffer).Size == true)) {
        auVar56._0_8_ = (plot->XAxis).Range.Max - (plot->XAxis).Range.Min;
        auVar56._8_8_ = plot->YAxis[0].Range.Max - plot->YAxis[0].Range.Min;
        auVar50._0_8_ = (double)(plot->XAxis).Pixels;
        auVar50._8_8_ = (double)plot->YAxis[0].Pixels;
        auVar57 = divpd(auVar56,auVar50);
        dStack_150 = auVar57._8_8_;
        uVar43 = -(ulong)(dStack_150 <= auVar57._0_8_);
        local_158 = (ImDrawList *)(~uVar43 & (ulong)dStack_150 | (ulong)auVar57._0_8_ & uVar43);
        ImPlotAxis::SetAspect(local_170,(double)local_158);
        ImPlotAxis::SetAspect(this,(double)local_158);
      }
    }
    if ((((plot->Flags & 4) == 0) && (plot->PlotHovered == true)) &&
       ((local_128->MouseReleased[(pIVar13->InputMap).ContextMenuButton] == true &&
        ((plot->LegendHovered == false && (plot->ContextLocked == false)))))) {
      ImGui::OpenPopup("##PlotContext",0);
    }
    bVar17 = ImGui::BeginPopup("##PlotContext",0);
    if (bVar17) {
      ShowPlotContextMenu(plot);
      ImGui::EndPopup();
    }
    if (((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) &&
        ((plot->XAxis).ExtHovered == true)) &&
       (((local_128->MouseReleased[(pIVar13->InputMap).ContextMenuButton] == true &&
         (plot->LegendHovered == false)) && (plot->ContextLocked == false)))) {
      ImGui::OpenPopup("##XContext",0);
    }
    bVar17 = ImGui::BeginPopup("##XContext",0);
    if (bVar17) {
      ImGui::Text("X-Axis");
      ImGui::Separator();
      pIVar34 = (ImPlotAxis *)0x0;
      if ((char)plot->Flags < '\0') {
        pIVar34 = this;
      }
      ShowAxisContextMenu(local_170,pIVar34,true);
      ImGui::EndPopup();
    }
    lVar32 = 0;
    do {
      ImGui::PushID((int)lVar32);
      if ((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) &&
         ((this->ExtHovered == true &&
          (((local_128->MouseReleased[(pIVar13->InputMap).ContextMenuButton] == true &&
            (plot->LegendHovered == false)) && (plot->ContextLocked == false)))))) {
        ImGui::OpenPopup("##YContext",0);
      }
      bVar17 = ImGui::BeginPopup("##YContext",0);
      if (bVar17) {
        if (lVar32 == 0) {
          ImGui::Text("Y-Axis");
          ImGui::Separator();
          pIVar34 = local_170;
          if ((plot->Flags & 0x80) == 0) goto LAB_001b4bcf;
        }
        else {
          ImGui::Text("Y-Axis %d");
          ImGui::Separator();
LAB_001b4bcf:
          pIVar34 = (ImPlotAxis *)0x0;
        }
        ShowAxisContextMenu(this,pIVar34,false);
        ImGui::EndPopup();
      }
      ImGui::PopID();
      lVar32 = lVar32 + 1;
      this = this + 1;
    } while (lVar32 != 3);
    pdVar27 = (plot->XAxis).LinkedMin;
    if (pdVar27 != (double *)0x0) {
      *pdVar27 = (plot->XAxis).Range.Min;
    }
    pdVar27 = (plot->XAxis).LinkedMax;
    if (pdVar27 != (double *)0x0) {
      *pdVar27 = (plot->XAxis).Range.Max;
    }
    lVar32 = 0;
    do {
      puVar11 = *(undefined8 **)((long)&plot->YAxis[0].LinkedMin + lVar32);
      if (puVar11 != (undefined8 *)0x0) {
        *puVar11 = *(undefined8 *)((long)&plot->YAxis[0].Range.Min + lVar32);
      }
      puVar11 = *(undefined8 **)((long)&plot->YAxis[0].LinkedMax + lVar32);
      if (puVar11 != (undefined8 *)0x0) {
        *puVar11 = *(undefined8 *)((long)&plot->YAxis[0].Range.Max + lVar32);
      }
      lVar32 = lVar32 + 0x80;
    } while (lVar32 != 0x180);
    if ((plot->ContextLocked != false) &&
       (local_128->MouseReleased[(pIVar13->InputMap).BoxSelectButton] == true)) {
      plot->ContextLocked = false;
    }
    uVar18 = (plot->Items).Buf.Size;
    if (uVar18 == (plot->Items).Map.Data.Size) {
      if (0 < (int)uVar18) {
        lVar32 = (ulong)uVar18 - 1;
        auVar51._8_4_ = (int)lVar32;
        auVar51._0_8_ = lVar32;
        auVar51._12_4_ = (int)((ulong)lVar32 >> 0x20);
        pIVar10 = (plot->Items).Buf.Data;
        lVar32 = 0;
        auVar51 = auVar51 ^ _DAT_00347250;
        auVar58 = _DAT_0036ca20;
        do {
          auVar57 = auVar58 ^ _DAT_00347250;
          if ((bool)(~(auVar57._4_4_ == auVar51._4_4_ && auVar51._0_4_ < auVar57._0_4_ ||
                      auVar51._4_4_ < auVar57._4_4_) & 1)) {
            (&pIVar10->SeenThisFrame)[lVar32] = false;
          }
          if ((auVar57._12_4_ != auVar51._12_4_ || auVar57._8_4_ <= auVar51._8_4_) &&
              auVar57._12_4_ <= auVar51._12_4_) {
            (&pIVar10[1].SeenThisFrame)[lVar32] = false;
          }
          lVar35 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + 2;
          auVar58._8_8_ = lVar35 + 2;
          lVar32 = lVar32 + 0x20;
        } while ((ulong)(uVar18 + 1 >> 1) << 5 != lVar32);
      }
      plot->Initialized = true;
      ImGui::PopID();
      Reset(GImPlot);
      return;
    }
  }
  __assert_fail("Buf.Size == Map.Data.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x279,"int ImPool<ImPlotItem>::GetBufSize() const [T = ImPlotItem]");
LAB_001b4d65:
  pcVar23 = "T &ImVector<ImPlotTick>::operator[](int) [T = ImPlotTick]";
LAB_001b4d7a:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,pcVar23);
}

Assistant:

void EndPlot() {
    IM_ASSERT_USER_ERROR(GImPlot != NULL, "No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?");
    ImPlotContext& gp     = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Mismatched BeginPlot()/EndPlot()!");
    ImGuiContext &G       = *GImGui;
    ImPlotPlot &plot     = *gp.CurrentPlot;
    ImGuiWindow * Window  = G.CurrentWindow;
    ImDrawList & DrawList = *Window->DrawList;
    const ImGuiIO &   IO  = ImGui::GetIO();

    // AXIS STATES ------------------------------------------------------------

    const bool any_y_dragging = plot.YAxis[0].Dragging || plot.YAxis[1].Dragging || plot.YAxis[2].Dragging;

    // FINAL RENDER -----------------------------------------------------------

    // render grid (foreground)
    PushPlotClipRect(gp.Style.PlotBorderSize == 0 ? 1.0f : 0.0f);
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Foreground))
        RenderGridLinesX(DrawList, gp.XTicks, plot.PlotRect, plot.XAxis.ColorMaj, plot.XAxis.ColorMaj, gp.Style.MajorGridSize.x, gp.Style.MinorGridSize.x);
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (plot.YAxis[i].Present && !ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_Foreground))
            RenderGridLinesY(DrawList, gp.YTicks[i], plot.PlotRect,  plot.YAxis[i].ColorMaj,  plot.YAxis[i].ColorMin, gp.Style.MajorGridSize.y, gp.Style.MinorGridSize.y);
    }
    PopPlotClipRect();

    // render x-ticks
    PushPlotClipRect();
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoTickMarks)) {
        for (int t = 0; t < gp.XTicks.Size; t++) {
            ImPlotTick *xt = &gp.XTicks.Ticks[t];
            if (xt->Level == 0)
                DrawList.AddLine(ImVec2(xt->PixelPos, plot.PlotRect.Max.y),
                                ImVec2(xt->PixelPos, plot.PlotRect.Max.y - (xt->Major ? gp.Style.MajorTickLen.x : gp.Style.MinorTickLen.x)),
                                plot.XAxis.ColorMaj,
                                xt->Major ? gp.Style.MajorTickSize.x : gp.Style.MinorTickSize.x);
        }
    }
    PopPlotClipRect();

    // render y-ticks
    ImGui::PushClipRect(plot.PlotRect.Min, ImVec2(plot.FrameRect.Max.x, plot.PlotRect.Max.y), true);
    int axis_count = 0;
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (!plot.YAxis[i].Present) { continue; }
        axis_count++;
        float x_start = gp.YAxisReference[i];
        if (!ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoTickMarks)) {
            float direction = (i == 0) ? 1.0f : -1.0f;
            bool no_major = axis_count >= 3;
            for (int t = 0; t < gp.YTicks[i].Size; t++) {
                ImPlotTick *yt = &gp.YTicks[i].Ticks[t];
                ImVec2 start = ImVec2(x_start, yt->PixelPos);
                DrawList.AddLine(start,
                                 start + ImVec2(direction * ((!no_major && yt->Major) ? gp.Style.MajorTickLen.y : gp.Style.MinorTickLen.y), 0),
                                 plot.YAxis[i].ColorMaj,
                                 (!no_major && yt->Major) ? gp.Style.MajorTickSize.y : gp.Style.MinorTickSize.y);
            }
        }
        if (axis_count >= 3) {
            // Draw a bar next to the ticks to act as a visual separator.
            DrawList.AddLine(ImVec2(x_start, plot.PlotRect.Min.y), ImVec2(x_start, plot.PlotRect.Max.y), GetStyleColorU32(ImPlotCol_YAxisGrid3), 1);
        }
    }
    ImGui::PopClipRect();

    // render annotations
    PushPlotClipRect();
    for (int i = 0; i < gp.Annotations.Size; ++i) {
        const char* txt       = gp.Annotations.GetText(i);
        ImPlotAnnotation& an  = gp.Annotations.Annotations[i];
        const ImVec2 txt_size = ImGui::CalcTextSize(txt);
        const ImVec2 size     = txt_size + gp.Style.AnnotationPadding * 2;
        ImVec2 pos            = an.Pos;
        if (an.Offset.x == 0)
            pos.x -= size.x / 2;
        else if (an.Offset.x > 0)
            pos.x += an.Offset.x;
        else
            pos.x -= size.x - an.Offset.x;
        if (an.Offset.y == 0)
            pos.y -= size.y / 2;
        else if (an.Offset.y > 0)
            pos.y += an.Offset.y;
        else
            pos.y -= size.y - an.Offset.y;
        if (an.Clamp)
            pos = ClampLabelPos(pos, size, plot.PlotRect.Min, plot.PlotRect.Max);
        ImRect rect(pos,pos+size);
        if (an.Offset.x != 0 || an.Offset.y != 0) {
            ImVec2 corners[4] = {rect.GetTL(), rect.GetTR(), rect.GetBR(), rect.GetBL()};
            int min_corner = 0;
            float min_len = FLT_MAX;
            for (int c = 0; c < 4; ++c) {
                float len = ImLengthSqr(an.Pos - corners[c]);
                if (len < min_len) {
                    min_corner = c;
                    min_len = len;
                }
            }
            DrawList.AddLine(an.Pos, corners[min_corner], an.ColorBg);
        }
        DrawList.AddRectFilled(rect.Min, rect.Max, an.ColorBg);
        DrawList.AddText(pos + gp.Style.AnnotationPadding, an.ColorFg, txt);
    }

    // render selection
    if (plot.Selected)
        RenderSelectionRect(DrawList, plot.SelectRect.Min + plot.PlotRect.Min, plot.SelectRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Selection));
    // render query
    if (plot.Queried)
        RenderSelectionRect(DrawList, plot.QueryRect.Min + plot.PlotRect.Min, plot.QueryRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Query));

    // render crosshairs
    if (ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs) && plot.PlotHovered && !(plot.XAxis.Dragging || any_y_dragging) && !plot.Selecting && !plot.Querying && !plot.LegendHovered) {
        ImGui::SetMouseCursor(ImGuiMouseCursor_None);
        ImVec2 xy = IO.MousePos;
        ImVec2 h1(plot.PlotRect.Min.x, xy.y);
        ImVec2 h2(xy.x - 5, xy.y);
        ImVec2 h3(xy.x + 5, xy.y);
        ImVec2 h4(plot.PlotRect.Max.x, xy.y);
        ImVec2 v1(xy.x, plot.PlotRect.Min.y);
        ImVec2 v2(xy.x, xy.y - 5);
        ImVec2 v3(xy.x, xy.y + 5);
        ImVec2 v4(xy.x, plot.PlotRect.Max.y);
        ImU32 col = GetStyleColorU32(ImPlotCol_Crosshairs);
        DrawList.AddLine(h1, h2, col);
        DrawList.AddLine(h3, h4, col);
        DrawList.AddLine(v1, v2, col);
        DrawList.AddLine(v3, v4, col);
    }

    // render mouse pos
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos) && plot.PlotHovered) {
        char buffer[128] = {};
        ImBufferWriter writer(buffer, sizeof(buffer));
        // x
        if (ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Time)) {
            ImPlotTimeUnit unit = GetUnitForRange(plot.XAxis.Range.Size() / (plot.PlotRect.GetWidth() / 100));
            const int written = FormatDateTime(ImPlotTime::FromDouble(gp.MousePos[0].x), &writer.Buffer[writer.Pos], writer.Size - writer.Pos - 1, GetDateTimeFmt(TimeFormatMouseCursor, unit));
            if (written > 0)
                writer.Pos += ImMin(written, writer.Size - writer.Pos - 1);
        }
        else {
            writer.Write(GetFormatX(), RoundAxisValue(plot.XAxis, gp.XTicks, gp.MousePos[0].x));
        }
        // y1
        writer.Write(", ");
        writer.Write(GetFormatY(0), RoundAxisValue(plot.YAxis[0], gp.YTicks[0], gp.MousePos[0].y));
        // y2
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            writer.Write(", (");
            writer.Write(GetFormatY(1), RoundAxisValue(plot.YAxis[1], gp.YTicks[1], gp.MousePos[1].y));
            writer.Write(")");
        }
        // y3
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            writer.Write(", (");
            writer.Write(GetFormatY(2), RoundAxisValue(plot.YAxis[2], gp.YTicks[2], gp.MousePos[2].y));
            writer.Write(")");
        }
        const ImVec2 size = ImGui::CalcTextSize(buffer);
        const ImVec2 pos = GetLocationPos(plot.PlotRect, size, plot.MousePosLocation, gp.Style.MousePosPadding);
        DrawList.AddText(pos, GetStyleColorU32(ImPlotCol_InlayText), buffer);
    }
    PopPlotClipRect();

    // reset legend hovers
    plot.LegendHovered = false;
    for (int i = 0; i < plot.Items.GetBufSize(); ++i)
        plot.Items.GetByIndex(i)->LegendHovered = false;
    // render legend
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend) && plot.GetLegendCount() > 0) {
        const ImVec2 legend_size = CalcLegendSize(plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation);
        const ImVec2 legend_pos  = GetLocationPos(plot.LegendOutside ? plot.FrameRect : plot.PlotRect,
                                                  legend_size,
                                                  plot.LegendLocation,
                                                  plot.LegendOutside ? gp.Style.PlotPadding : gp.Style.LegendPadding);
        plot.LegendRect = ImRect(legend_pos, legend_pos + legend_size);
        // test hover
        plot.LegendHovered = plot.FrameHovered && plot.LegendRect.Contains(IO.MousePos);

        if (plot.LegendOutside)
            ImGui::PushClipRect(plot.FrameRect.Min, plot.FrameRect.Max, true);
        else
            PushPlotClipRect();
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(plot.LegendRect.Min, plot.LegendRect.Max, col_bg);
        DrawList.AddRect(plot.LegendRect.Min, plot.LegendRect.Max, col_bd);
        ShowLegendEntries(plot, plot.LegendRect, plot.LegendHovered, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation, DrawList);
        ImGui::PopClipRect();
    }
    else {
        plot.LegendRect = ImRect();
    }
    if (plot.LegendFlipSideNextFrame)  {
        plot.LegendOutside  = !plot.LegendOutside;
        plot.LegendFlipSideNextFrame = false;
    }

    // render border
    if (gp.Style.PlotBorderSize > 0)
        DrawList.AddRect(plot.PlotRect.Min, plot.PlotRect.Max, GetStyleColorU32(ImPlotCol_PlotBorder), 0, ImDrawFlags_RoundCornersAll, gp.Style.PlotBorderSize);

    // FIT DATA --------------------------------------------------------------
    const bool axis_equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (gp.FitThisFrame && (gp.VisibleItemCount > 0 || plot.Queried)) {
        if (gp.FitX) {
            const double ext_size = gp.ExtentsX.Size() * 0.5;
            gp.ExtentsX.Min -= ext_size * gp.Style.FitPadding.x;
            gp.ExtentsX.Max += ext_size * gp.Style.FitPadding.x;
            if (!plot.XAxis.IsLockedMin() && !ImNanOrInf(gp.ExtentsX.Min))
                plot.XAxis.Range.Min = (gp.ExtentsX.Min);
            if (!plot.XAxis.IsLockedMax() && !ImNanOrInf(gp.ExtentsX.Max))
                plot.XAxis.Range.Max = (gp.ExtentsX.Max);
            if (ImAlmostEqual(plot.XAxis.Range.Max, plot.XAxis.Range.Min))  {
                plot.XAxis.Range.Max += 0.5;
                plot.XAxis.Range.Min -= 0.5;
            }
            plot.XAxis.Constrain();
            if (axis_equal && !gp.FitY[0])
                plot.YAxis[0].SetAspect(plot.XAxis.GetAspect());
        }
        for (int i = 0; i < IMPLOT_Y_AXES; i++) {
            if (gp.FitY[i]) {
                const double ext_size = gp.ExtentsY[i].Size() * 0.5;
                gp.ExtentsY[i].Min -= ext_size * gp.Style.FitPadding.y;
                gp.ExtentsY[i].Max += ext_size * gp.Style.FitPadding.y;
                if (!plot.YAxis[i].IsLockedMin() && !ImNanOrInf(gp.ExtentsY[i].Min))
                    plot.YAxis[i].Range.Min = (gp.ExtentsY[i].Min);
                if (!plot.YAxis[i].IsLockedMax() && !ImNanOrInf(gp.ExtentsY[i].Max))
                    plot.YAxis[i].Range.Max = (gp.ExtentsY[i].Max);
                if (ImAlmostEqual(plot.YAxis[i].Range.Max, plot.YAxis[i].Range.Min)) {
                    plot.YAxis[i].Range.Max += 0.5;
                    plot.YAxis[i].Range.Min -= 0.5;
                }
                plot.YAxis[i].Constrain();
                if (i == 0 && axis_equal && !gp.FitX)
                    plot.XAxis.SetAspect(plot.YAxis[0].GetAspect());
            }
        }
        if (axis_equal && gp.FitX && gp.FitY[0]) {
            double aspect = ImMax(plot.XAxis.GetAspect(), plot.YAxis[0].GetAspect());
            plot.XAxis.SetAspect(aspect);
            plot.YAxis[0].SetAspect(aspect);
        }
    }

    // CONTEXT MENUS -----------------------------------------------------------

    // main ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.PlotHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##PlotContext");
    if (ImGui::BeginPopup("##PlotContext")) {
        ShowPlotContextMenu(plot);
        ImGui::EndPopup();
    }

    // x-axis ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.XAxis.ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##XContext");
    if (ImGui::BeginPopup("##XContext")) {
        ImGui::Text("X-Axis"); ImGui::Separator();
        ShowAxisContextMenu(plot.XAxis, ImHasFlag(plot.Flags, ImPlotFlags_Equal) ? &plot.YAxis[0] : NULL, true);
        ImGui::EndPopup();
    }

    // y-axes ctx menus
    for (int i = 0; i < IMPLOT_Y_AXES; ++i) {
        ImGui::PushID(i);
        if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.YAxis[i].ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
            ImGui::OpenPopup("##YContext");
        if (ImGui::BeginPopup("##YContext")) {
            if (i == 0) {
                ImGui::Text("Y-Axis"); ImGui::Separator();
            }
            else {
                ImGui::Text("Y-Axis %d", i + 1); ImGui::Separator();
            }
            ShowAxisContextMenu(plot.YAxis[i], (i == 0 && ImHasFlag(plot.Flags, ImPlotFlags_Equal)) ? &plot.XAxis : NULL, false);
            ImGui::EndPopup();
        }
        ImGui::PopID();
    }


    // LINKED AXES ------------------------------------------------------------

    PushLinkedAxis(plot.XAxis);
    for (int i = 0; i < IMPLOT_Y_AXES; ++i)
        PushLinkedAxis(plot.YAxis[i]);

    // CLEANUP ----------------------------------------------------------------

    // resset context locked flag
    if (plot.ContextLocked && IO.MouseReleased[gp.InputMap.BoxSelectButton])
        plot.ContextLocked = false;


    // reset the plot items for the next frame
    for (int i = 0; i < plot.Items.GetBufSize(); ++i) {
        plot.Items.GetByIndex(i)->SeenThisFrame = false;
    }

    // mark the plot as initialized, i.e. having made it through one frame completely
    plot.Initialized = true;

    // Pop ImGui::PushID at the end of BeginPlot
    ImGui::PopID();
    // Reset context for next plot
    Reset(GImPlot);
}